

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

sexp_conflict
sexp_string_hash(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict str,
                sexp_conflict bound)

{
  sexp psVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)bound & 1) == 0) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,bound);
      return psVar3;
    }
    uVar4 = 0x811c9dc5;
    psVar1 = (str->value).type.name;
    psVar2 = (str->value).type.cpl;
    cVar5 = ((psVar1->value).flonum_bits + 8)[(long)psVar2];
    if (cVar5 != '\0') {
      pcVar6 = (psVar2->value).flonum_bits + (long)&(psVar1->value).flonum + 1;
      do {
        uVar4 = (long)cVar5 ^ uVar4 * 0x1000193;
        cVar5 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar5 != '\0');
    }
    return (sexp_conflict)((uVar4 % (ulong)((long)bound >> 1)) * 2 + 1);
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,9);
  return psVar3;
}

Assistant:

sexp sexp_string_hash (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp bound) {
  if (! sexp_stringp(str))
    return sexp_type_exception(ctx, self, SEXP_STRING, str);
  else if (! sexp_fixnump(bound))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, bound);
  return sexp_make_fixnum(string_hash(sexp_string_data(str),
                                      sexp_unbox_fixnum(bound)));
}